

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_GIF.cpp
# Opt level: O0

int __thiscall Am_GIF_Image::process_gif(Am_GIF_Image *this,ifstream *ifs,GIF_Load_Info *gli)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ulong uVar5;
  unsigned_short local_6172;
  ushort local_616e;
  ushort local_616c;
  short j;
  unsigned_short input_code;
  unsigned_short pixel;
  unsigned_short oldcode;
  unsigned_short curcode;
  unsigned_long tmp;
  uint i;
  unsigned_short count;
  unsigned_long val;
  ushort local_6148;
  ushort local_6146;
  ushort local_6144;
  unsigned_short bitpos;
  unsigned_short read_mask;
  unsigned_short max_code;
  unsigned_short code_size;
  unsigned_short free_code;
  unsigned_short eoi_code;
  unsigned_short clear_code;
  unsigned_short init_code_size;
  unsigned_short istk;
  unsigned_short stack [4096];
  unsigned_short suffix [4096];
  unsigned_short prefix [4096];
  byte local_128 [6];
  unsigned_short data_mask;
  uchar buf [256];
  GIF_Load_Info *gli_local;
  ifstream *ifs_local;
  Am_GIF_Image *this_local;
  
  uVar1 = (short)(this->super_Am_Generic_Image).iminfo.num_colors - 1;
  gli->x = 0;
  gli->y = 0;
  buf._248_8_ = gli;
  uVar2 = std::istream::get();
  if ((uVar2 < 2) || (8 < uVar2)) {
    this_local._4_4_ = 0;
  }
  else {
    uVar3 = (ushort)(1 << ((byte)uVar2 & 0x1f));
    bitpos = uVar3 + 2;
    local_6144 = uVar2 + 1;
    local_6146 = (ushort)(1 << ((byte)local_6144 & 0x1f));
    local_6148 = local_6146 - 1;
    std::ios::clear((int)ifs + (int)*(undefined8 *)(*(long *)ifs + -0x18));
    val._6_2_ = 0;
    _i = 0;
    tmp._6_2_ = std::istream::get();
    while (tmp._6_2_ != 0) {
      std::istream::read((char *)ifs,(long)local_128);
      uVar5 = std::ios::fail();
      if ((uVar5 & 1) != 0) {
        return 0;
      }
      for (tmp._0_4_ = 0; (uint)tmp < tmp._6_2_; tmp._0_4_ = (uint)tmp + 1) {
        _i = (ulong)local_128[(uint)tmp] << ((byte)val._6_2_ & 0x3f) | _i;
        val._6_2_ = val._6_2_ + 8;
        while (local_6144 <= val._6_2_) {
          uVar4 = (ushort)_i & local_6148;
          _i = _i >> ((byte)local_6144 & 0x3f);
          val._6_2_ = val._6_2_ - local_6144;
          if (uVar4 == (ushort)(uVar3 + 1)) {
            return 1;
          }
          if (uVar4 == uVar3) {
            bitpos = (short)(1 << ((byte)uVar2 & 0x1f)) + 2;
            local_6144 = uVar2 + 1;
            local_6146 = (ushort)(1 << ((byte)local_6144 & 0x1f));
            local_6148 = local_6146 - 1;
            local_616c = 0xffff;
          }
          else if (local_616c == 0xffff) {
            local_616e = uVar4 & uVar1;
            add_to_image(this,(GIF_Load_Info *)buf._248_8_,local_616e);
            local_616c = uVar4;
          }
          else {
            j = uVar4;
            if (bitpos <= uVar4) {
              eoi_code = local_616e & 0xff;
              j = local_616c;
            }
            free_code = (unsigned_short)(bitpos <= uVar4);
            for (; uVar1 < (ushort)j; j = suffix[(ulong)(ushort)j + 0xffc]) {
              if ((0xfff < (ushort)j) || (0xffd < free_code)) {
                return 0;
              }
              (&eoi_code)[free_code] = stack[(ulong)(ushort)j + 0xffc];
              free_code = free_code + 1;
            }
            local_616e = j & uVar1;
            (&eoi_code)[free_code] = local_616e & 0xff;
            for (local_6172 = free_code; -1 < (short)local_6172; local_6172 = local_6172 - 1) {
              add_to_image(this,(GIF_Load_Info *)buf._248_8_,(&eoi_code)[(short)local_6172]);
            }
            suffix[(ulong)bitpos + 0xffc] = local_616c;
            stack[(ulong)bitpos + 0xffc] = local_616e & 0xff;
            bitpos = bitpos + 1;
            local_616c = uVar4;
            if ((local_6146 <= bitpos) && (local_6144 < 0xc)) {
              local_6144 = local_6144 + 1;
              local_6146 = local_6146 * 2;
              local_6148 = local_6146 - 1;
            }
          }
        }
      }
      tmp._6_2_ = std::istream::get();
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int
Am_GIF_Image::process_gif(std::ifstream &ifs, GIF_Load_Info &gli)
{
  // Buffer to hold a block of image data from the GIF file.
  unsigned char buf[256];
  unsigned short data_mask = iminfo.num_colors - 1;

  unsigned short prefix[GIF_TBLSIZE];
  unsigned short suffix[GIF_TBLSIZE];
  unsigned short stack[GIF_TBLSIZE];

  unsigned short istk = 0;

  gli.x = 0;
  gli.y = 0; // initial values

  // Next byte is the initial number of bits used for LZW codes
  unsigned short init_code_size = ifs.get();

  if (init_code_size < 2 || init_code_size > 8) {
    return 0;
  }

  unsigned short clear_code = 1 << init_code_size;
  unsigned short eoi_code = clear_code + 1;
  unsigned short free_code = clear_code + 2;

  // The GIF specification says that, for decompression, the code
  // size should be one bit longer than the initial code size.
  unsigned short code_size = init_code_size + 1;

  // Bit mask needed to extract data bits corresponding to the
  // code size.
  unsigned short max_code = 1 << code_size;
  unsigned short read_mask = max_code - 1;

  ifs.clear();

  unsigned short bitpos = 0;
  unsigned long val = 0;

  for (unsigned short count = ifs.get(); count > 0; count = ifs.get()) {
    // Read a block of data into the buffer
    // ifs.read(buf, count); MSL
    ifs.read((char *)buf, count);
    if (ifs.fail()) {
      return 0;
    }

    // Process the contents of the buffer
    for (unsigned int i = 0; i < count; i++) {
      const unsigned long tmp = buf[i];
      val |= (tmp << bitpos);
      bitpos += 8;

      while (bitpos >= code_size) {
        unsigned short curcode = (unsigned short)(val & read_mask);
        val >>= code_size;
        bitpos -= code_size;
        if (curcode == eoi_code) {
          return 1;
        }
        unsigned short oldcode;
        unsigned short pixel;
        if (curcode == clear_code) {
          free_code = (1 << init_code_size) + 2;
          code_size = init_code_size + 1;
          max_code = 1 << code_size;
          read_mask = max_code - 1;
          istk = 0;
          oldcode = 0xffff;
        } else {
          if (oldcode == 0xffff) {
            // First code, after initialization, is a raw pixel value
            pixel = curcode & data_mask;
            add_to_image(gli, pixel);
            oldcode = curcode;
          } else {
            const unsigned short input_code = curcode;
            if (curcode >= free_code) {
              // Code is not in table yet. Save last character in stack
              stack[istk++] = (unsigned char)pixel;
              curcode = oldcode;
            }
            while (curcode > data_mask) {
              // [eab] I don't know enough about the LZW algorithm
              // to introduce more precise range tests than the following
              // on curcode and istk
              if (curcode >= GIF_TBLSIZE || istk >= GIF_TBLSIZE - 2) {
                return 0; // corrupt GIF
              }
              // Save bytes corresponding to compression code in stack for
              // later use.
              stack[istk++] = suffix[curcode];
              curcode = prefix[curcode];
            }

            pixel = curcode & data_mask;
            stack[istk++] = (unsigned char)pixel;

            // Add decoded string of bytes to image
            for (short j = istk - 1; j >= 0; j--)
              add_to_image(gli, stack[j]);

            istk = 0;

            // Add current information to decompression tables
            prefix[free_code] = oldcode;
            suffix[free_code] = (unsigned char)pixel;
            oldcode = input_code;

            // Adjust code size, if necessary.
            free_code++;
            if (free_code >= max_code) {
              if (code_size < GIF_MAXCODE) {
                code_size++;
                max_code *= 2;
                read_mask = max_code - 1;
              }
            }
          }
        }
      }
    }
  }
  return 1;
}